

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CClass *stm)

{
  bool bVar1;
  pointer pCVar2;
  pointer pCVar3;
  pointer pCVar4;
  CClass *stm_local;
  CConvertVisitor *this_local;
  
  std::__cxx11::string::operator+=((string *)&this->code,"class ");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->id);
  if (bVar1) {
    pCVar2 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&stm->id);
    (**(pCVar2->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar2,this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->parentClass);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)&this->code," extends ");
    pCVar2 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&stm->parentClass);
    (**(pCVar2->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar2,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code," {\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->fields);
  if (bVar1) {
    pCVar3 = std::unique_ptr<CFieldList,_std::default_delete<CFieldList>_>::operator->(&stm->fields)
    ;
    (**(pCVar3->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->methods);
  if (bVar1) {
    pCVar4 = std::unique_ptr<CMethodList,_std::default_delete<CMethodList>_>::operator->
                       (&stm->methods);
    (**(pCVar4->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar4,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code,"}\n\n");
  return;
}

Assistant:

void CConvertVisitor::Visit(CClass &stm) {
	this->code += "class ";
	if (stm.id) {
		stm.id->Accept(*this);
	}
	if (stm.parentClass) {
		this->code += " extends ";
		stm.parentClass->Accept(*this);
	}
	this->code += " {\n";
	if (stm.fields) {
		stm.fields->Accept(*this);
	}
	if (stm.methods) {
		stm.methods->Accept(*this);
	}
	this->code += "}\n\n";
}